

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::rectMesh(Mesh *__return_storage_ptr__,float _x,float _y,float _w,float _h)

{
  vec2 local_100;
  vec3 local_f8;
  vec<4,_float,_(glm::qualifier)0> local_ec;
  vec3 local_dc;
  vec2 local_d0;
  vec3 local_c8;
  vec<4,_float,_(glm::qualifier)0> local_bc;
  vec3 local_ac;
  vec2 local_a0;
  vec3 local_98;
  vec<4,_float,_(glm::qualifier)0> local_8c;
  vec3 local_7c;
  vec2 local_70;
  vec3 local_68;
  vec<4,_float,_(glm::qualifier)0> local_5c;
  vec3 local_40;
  undefined1 local_31;
  float local_30;
  float local_2c;
  float h;
  float w;
  float y;
  float x;
  float _h_local;
  float _w_local;
  float _y_local;
  float _x_local;
  Mesh *mesh;
  
  w = _x + _x + -1.0;
  h = _y + _y + -1.0;
  local_2c = _w + _w;
  local_30 = _h + _h;
  local_31 = 0;
  y = _h;
  x = _w;
  _h_local = _y;
  _w_local = _x;
  __y_local = __return_storage_ptr__;
  Mesh::Mesh(__return_storage_ptr__);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_40,w,h,0.0);
  Mesh::addVertex(__return_storage_ptr__,&local_40);
  glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_5c,1.0);
  Mesh::addColor(__return_storage_ptr__,&local_5c);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_68,0.0,0.0,1.0);
  Mesh::addNormal(__return_storage_ptr__,&local_68);
  glm::vec<2,float,(glm::qualifier)0>::vec<double,double>
            ((vec<2,float,(glm::qualifier)0> *)&local_70,0.0,0.0);
  Mesh::addTexCoord(__return_storage_ptr__,&local_70);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_7c,w + local_2c,h,0.0);
  Mesh::addVertex(__return_storage_ptr__,&local_7c);
  glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_8c,1.0);
  Mesh::addColor(__return_storage_ptr__,&local_8c);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_98,0.0,0.0,1.0);
  Mesh::addNormal(__return_storage_ptr__,&local_98);
  glm::vec<2,float,(glm::qualifier)0>::vec<double,double>
            ((vec<2,float,(glm::qualifier)0> *)&local_a0,1.0,0.0);
  Mesh::addTexCoord(__return_storage_ptr__,&local_a0);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_ac,w + local_2c,h + local_30,0.0);
  Mesh::addVertex(__return_storage_ptr__,&local_ac);
  glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_bc,1.0);
  Mesh::addColor(__return_storage_ptr__,&local_bc);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_c8,0.0,0.0,1.0);
  Mesh::addNormal(__return_storage_ptr__,&local_c8);
  glm::vec<2,float,(glm::qualifier)0>::vec<double,double>
            ((vec<2,float,(glm::qualifier)0> *)&local_d0,1.0,1.0);
  Mesh::addTexCoord(__return_storage_ptr__,&local_d0);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_dc,w,h + local_30,0.0);
  Mesh::addVertex(__return_storage_ptr__,&local_dc);
  glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_ec,1.0);
  Mesh::addColor(__return_storage_ptr__,&local_ec);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_f8,0.0,0.0,1.0);
  Mesh::addNormal(__return_storage_ptr__,&local_f8);
  glm::vec<2,float,(glm::qualifier)0>::vec<double,double>
            ((vec<2,float,(glm::qualifier)0> *)&local_100,0.0,1.0);
  Mesh::addTexCoord(__return_storage_ptr__,&local_100);
  Mesh::addIndex(__return_storage_ptr__,0);
  Mesh::addIndex(__return_storage_ptr__,1);
  Mesh::addIndex(__return_storage_ptr__,2);
  Mesh::addIndex(__return_storage_ptr__,2);
  Mesh::addIndex(__return_storage_ptr__,3);
  Mesh::addIndex(__return_storage_ptr__,0);
  return __return_storage_ptr__;
}

Assistant:

Mesh rectMesh(float _x, float _y, float _w, float _h) {
    float x = _x * 2.0f - 1.0f;
    float y = _y * 2.0f - 1.0f;
    float w = _w * 2.0f;
    float h = _h * 2.0f;

    Mesh mesh;
    mesh.addVertex(glm::vec3(x, y, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(0.0, 0.0));

    mesh.addVertex(glm::vec3(x+w, y, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(1.0, 0.0));

    mesh.addVertex(glm::vec3(x+w, y+h, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(1.0, 1.0));

    mesh.addVertex(glm::vec3(x, y+h, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(0.0, 1.0));

    mesh.addIndex(0);   mesh.addIndex(1);   mesh.addIndex(2);
    mesh.addIndex(2);   mesh.addIndex(3);   mesh.addIndex(0);

    return mesh;
}